

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

bool DoLoadGLNodes(FileReader **lumps)

{
  ushort uVar1;
  int iVar2;
  FileReader *pFVar3;
  seg_t *psVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vertex_t *__src;
  subsector_t *psVar9;
  bool bVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  double *pdVar14;
  ushort *puVar15;
  long lVar16;
  seg_t **ppsVar17;
  sector_t_conflict *psVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  mapsubsector_t *data;
  line_t_conflict *plVar23;
  ulong uVar24;
  long lVar25;
  ushort *puVar26;
  
  pFVar3 = *lumps;
  firstglvertex = numvertexes;
  lVar13 = pFVar3->Length;
  uVar19 = (ulong)(int)lVar13;
  piVar12 = (int *)operator_new__(uVar19);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,piVar12,uVar19);
  __src = vertexes;
  iVar21 = *piVar12;
  if ((iVar21 != 0x32644e67) && (iVar21 != 0x35644e67)) {
    Printf("GL nodes v%d found. This format is not supported by ZDoom\n",
           (ulong)((uint)(iVar21 == 0x34644e67) * 3 + 1));
    operator_delete__(piVar12);
    return false;
  }
  format5 = iVar21 == 0x35644e67;
  iVar21 = (int)((ulong)((lVar13 << 0x20) + -0x400000000 >> 0x20) >> 3) + numvertexes;
  uVar19 = 0xffffffffffffffff;
  if (-1 < iVar21) {
    uVar19 = (long)iVar21 << 4;
  }
  numvertexes = iVar21;
  vertexes = (vertex_t *)operator_new__(uVar19);
  iVar2 = firstglvertex;
  lVar20 = (long)firstglvertex;
  memcpy(vertexes,__src,lVar20 * 0x10);
  lVar13 = (long)numlines;
  if (0 < lVar13) {
    lVar16 = 0;
    do {
      *(long *)((long)lines->args + lVar16 + -0x2c) =
           (*(long *)((long)lines->args + lVar16 + -0x2c) - (long)__src) + (long)vertexes;
      *(long *)((long)lines->args + lVar16 + -0x24) =
           (*(long *)((long)lines->args + lVar16 + -0x24) - (long)__src) + (long)vertexes;
      lVar16 = lVar16 + 0x98;
    } while (lVar13 * 0x98 - lVar16 != 0);
  }
  if (iVar2 < iVar21) {
    pdVar14 = &vertexes[lVar20].p.Y;
    lVar13 = 0;
    do {
      iVar2 = piVar12[lVar13 * 2 + 2];
      ((DVector2 *)(pdVar14 + -1))->X = (double)piVar12[lVar13 * 2 + 1] * 1.52587890625e-05;
      *pdVar14 = (double)iVar2 * 1.52587890625e-05;
      lVar13 = lVar13 + 1;
      pdVar14 = pdVar14 + 2;
    } while (iVar21 - lVar20 != lVar13);
  }
  operator_delete__(piVar12);
  pFVar3 = lumps[1];
  numsegs = (int)pFVar3->Length;
  puVar15 = (ushort *)operator_new__((long)numsegs);
  lVar13 = 0;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,puVar15,(long)numsegs);
  segs = (seg_t *)0x0;
  if (format5 == '\0') {
    if (*(int *)puVar15 == 0x33644e67) {
      lVar13 = 4;
      numsegs = numsegs + -4;
      goto LAB_003f93a5;
    }
    iVar21 = (int)((ulong)(long)numsegs / 10);
    uVar24 = (ulong)iVar21;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar24;
    uVar19 = SUB168(auVar6 * ZEXT816(0x30),0);
    if (SUB168(auVar6 * ZEXT816(0x30),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    numsegs = iVar21;
    segs = (seg_t *)operator_new__(uVar19);
    uVar19 = uVar24 * 0x10;
    memset(segs,0,uVar24 * 0x30);
    if (iVar21 < 0) {
      uVar19 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar19);
    iVar2 = firstglvertex;
    if (0 < iVar21) {
      lVar13 = 0;
      lVar20 = 0;
      lVar16 = 0;
      puVar26 = puVar15;
      do {
        uVar1 = *puVar26;
        uVar11 = (uVar1 & 0x7fff) + iVar2;
        if (-1 < (short)uVar1) {
          uVar11 = (uint)uVar1;
        }
        *(vertex_t **)((long)&segs->v1 + lVar20) = vertexes + (int)uVar11;
        uVar1 = puVar26[1];
        uVar11 = (uVar1 & 0x7fff) + iVar2;
        if (-1 < (short)uVar1) {
          uVar11 = (uint)uVar1;
        }
        *(vertex_t **)((long)&segs->v2 + lVar20) = vertexes + (int)uVar11;
        uVar11 = (uint)puVar26[4];
        if (uVar11 == 0xffff) {
          uVar11 = 0xffffffff;
        }
        *(uint *)((long)&glsegextras->PartnerSeg + lVar13) = uVar11;
        if ((ulong)puVar26[2] == 0xffff) {
          *(undefined8 *)((long)&segs->linedef + lVar20) = 0;
          *(undefined8 *)((long)&segs->sidedef + lVar20) = 0;
          *(undefined8 *)((long)&segs->frontsector + lVar20) = 0;
          psVar18 = (sector_t_conflict *)0x0;
        }
        else {
          plVar23 = lines + puVar26[2];
          *(line_t_conflict **)((long)&segs->linedef + lVar20) = plVar23;
          uVar1 = puVar26[3];
          *(side_t **)((long)&segs->sidedef + lVar20) = plVar23->sidedef[uVar1];
          if (plVar23->sidedef[uVar1] == (side_t *)0x0) {
            psVar18 = (sector_t_conflict *)0x0;
          }
          else {
            psVar18 = plVar23->sidedef[uVar1]->sector;
          }
          *(sector_t_conflict **)((long)&segs->frontsector + lVar20) = psVar18;
          if (((plVar23->flags & 4) == 0) || (plVar23->sidedef[uVar1 ^ 1] == (side_t *)0x0)) {
            plVar23->flags = plVar23->flags & 0xfffffffb;
            psVar18 = (sector_t_conflict *)0x0;
          }
          else {
            psVar18 = plVar23->sidedef[uVar1 ^ 1]->sector;
          }
        }
        *(sector_t_conflict **)((long)&segs->backsector + lVar20) = psVar18;
        lVar16 = lVar16 + 1;
        lVar20 = lVar20 + 0x30;
        lVar13 = lVar13 + 0x10;
        puVar26 = puVar26 + 5;
      } while (lVar16 < numsegs);
    }
  }
  else {
LAB_003f93a5:
    iVar21 = numsegs >> 4;
    uVar24 = (ulong)iVar21;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar24;
    uVar19 = SUB168(auVar5 * ZEXT816(0x30),0);
    if (SUB168(auVar5 * ZEXT816(0x30),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    numsegs = iVar21;
    segs = (seg_t *)operator_new__(uVar19);
    uVar19 = uVar24 * 0x10;
    memset(segs,0,uVar24 * 0x30);
    if (iVar21 < 0) {
      uVar19 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar19);
    iVar2 = firstglvertex;
    if (0 < iVar21) {
      lVar20 = 0;
      lVar16 = 0;
      lVar25 = 0;
      do {
        uVar11 = *(uint *)((long)puVar15 + lVar20 + lVar13);
        uVar22 = (uVar11 & 0x3fffffff) + iVar2;
        if (uVar11 < 0x40000000) {
          uVar22 = uVar11;
        }
        *(vertex_t **)((long)&segs->v1 + lVar16) = vertexes + (int)uVar22;
        uVar11 = *(uint *)((long)puVar15 + lVar20 + lVar13 + 4);
        uVar22 = (uVar11 & 0x3fffffff) + iVar2;
        if (uVar11 < 0x40000000) {
          uVar22 = uVar11;
        }
        *(vertex_t **)((long)&segs->v2 + lVar16) = vertexes + (int)uVar22;
        *(undefined4 *)((long)&glsegextras->PartnerSeg + lVar20) =
             *(undefined4 *)((long)puVar15 + lVar20 + lVar13 + 0xc);
        uVar19 = (ulong)*(ushort *)((long)puVar15 + lVar20 + lVar13 + 8);
        if (uVar19 == 0xffff) {
          *(undefined8 *)((long)&segs->linedef + lVar16) = 0;
          *(undefined8 *)((long)&segs->sidedef + lVar16) = 0;
          *(undefined8 *)((long)&segs->frontsector + lVar16) = 0;
          psVar18 = (sector_t_conflict *)0x0;
        }
        else {
          plVar23 = lines + uVar19;
          *(line_t_conflict **)((long)&segs->linedef + lVar16) = plVar23;
          uVar1 = *(ushort *)((long)puVar15 + lVar20 + lVar13 + 10);
          *(side_t **)((long)&segs->sidedef + lVar16) = plVar23->sidedef[uVar1];
          if (plVar23->sidedef[uVar1] == (side_t *)0x0) {
            psVar18 = (sector_t_conflict *)0x0;
          }
          else {
            psVar18 = plVar23->sidedef[uVar1]->sector;
          }
          *(sector_t_conflict **)((long)&segs->frontsector + lVar16) = psVar18;
          if (((plVar23->flags & 4) == 0) || (plVar23->sidedef[uVar1 ^ 1] == (side_t *)0x0)) {
            plVar23->flags = plVar23->flags & 0xfffffffb;
            psVar18 = (sector_t_conflict *)0x0;
          }
          else {
            psVar18 = plVar23->sidedef[uVar1 ^ 1]->sector;
          }
        }
        *(sector_t_conflict **)((long)&segs->backsector + lVar16) = psVar18;
        lVar25 = lVar25 + 1;
        lVar16 = lVar16 + 0x30;
        lVar20 = lVar20 + 0x10;
      } while (lVar25 < numsegs);
    }
  }
  operator_delete__(puVar15);
  pFVar3 = lumps[2];
  numsubsectors = (int)pFVar3->Length;
  piVar12 = (int *)operator_new__((long)numsubsectors);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,piVar12,(long)numsubsectors);
  if (numsubsectors == 0) {
LAB_003f9a77:
    operator_delete__(piVar12);
    goto LAB_003f9a7f;
  }
  if (format5 == '\0') {
    if (*piVar12 == 0x33644e67) {
      lVar13 = 4;
      goto LAB_003f987c;
    }
    iVar21 = numsubsectors >> 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)iVar21;
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x30),8) == 0) {
      uVar19 = SUB168(auVar7 * ZEXT816(0x30),0);
    }
    numsubsectors = iVar21;
    subsectors = (subsector_t *)operator_new__(uVar19);
    memset(subsectors,0,(long)iVar21 * 0x30);
    if (0 < iVar21) {
      lVar13 = 0x28;
      lVar20 = 0;
      do {
        psVar9 = subsectors;
        *(uint *)((long)&subsectors->sector + lVar13) = (uint)*(ushort *)(piVar12 + lVar20);
        *(ulong *)((long)psVar9 + lVar13 + -0x10) =
             (long)&segs->v1 + (ulong)((uint)*(ushort *)((long)piVar12 + lVar20 * 4 + 2) * 0x30);
        if (*(int *)((long)&subsectors->sector + lVar13) == 0) goto LAB_003f9a77;
        lVar20 = lVar20 + 1;
        lVar13 = lVar13 + 0x30;
      } while (lVar20 < numsubsectors);
    }
  }
  else {
    lVar13 = 0;
LAB_003f987c:
    iVar21 = numsubsectors >> 3;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)iVar21;
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x30),8) == 0) {
      uVar19 = SUB168(auVar8 * ZEXT816(0x30),0);
    }
    numsubsectors = iVar21;
    subsectors = (subsector_t *)operator_new__(uVar19);
    memset(subsectors,0,(long)iVar21 * 0x30);
    if (0 < iVar21) {
      lVar20 = 0x28;
      lVar16 = 0;
      do {
        psVar9 = subsectors;
        *(undefined4 *)((long)&subsectors->sector + lVar20) =
             *(undefined4 *)((long)piVar12 + lVar16 * 8 + lVar13);
        *(seg_t **)((long)psVar9 + lVar20 + -0x10) =
             segs + *(int *)((long)piVar12 + lVar16 * 8 + lVar13 + 4);
        if (*(int *)((long)&subsectors->sector + lVar20) == 0) goto LAB_003f9a77;
        lVar16 = lVar16 + 1;
        lVar20 = lVar20 + 0x30;
      } while (lVar16 < numsubsectors);
    }
  }
  lVar13 = (long)numsubsectors;
  if (0 < lVar13) {
    lVar20 = 0;
    do {
      uVar19 = (ulong)subsectors[lVar20].numlines;
      if (subsectors[lVar20].numlines != 0) {
        lVar16 = 0x28;
        uVar24 = 0;
        do {
          psVar4 = subsectors[lVar20].firstline;
          if (*(long *)((long)psVar4 + lVar16 + -0x10) == 0) {
            psVar18 = psVar4->frontsector;
            *(sector_t_conflict **)((long)&psVar4->v1 + lVar16) = psVar18;
            *(sector_t_conflict **)((long)psVar4 + lVar16 + -8) = psVar18;
          }
          uVar24 = uVar24 + 1;
          uVar19 = (ulong)subsectors[lVar20].numlines;
          lVar16 = lVar16 + 0x30;
        } while (uVar24 < uVar19);
      }
      if (subsectors[lVar20].firstline[uVar19 - 1].v2 != (subsectors[lVar20].firstline)->v1)
      goto LAB_003f9a77;
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar13);
  }
  operator_delete__(piVar12);
  bVar10 = LoadNodes(lumps[3]);
  if (bVar10) {
    uVar19 = (ulong)numsubsectors;
    bVar10 = 0 < (long)uVar19;
    if (0 < (long)uVar19) {
      if (subsectors->firstline->sidedef != (side_t *)0x0) {
        ppsVar17 = &subsectors[1].firstline;
        uVar24 = 0;
        do {
          if (uVar19 - 1 == uVar24) goto LAB_003f9a55;
          psVar4 = *ppsVar17;
          ppsVar17 = ppsVar17 + 6;
          uVar24 = uVar24 + 1;
        } while (psVar4->sidedef != (side_t *)0x0);
        bVar10 = uVar24 < uVar19;
      }
      Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
      if (nodes != (node_t *)0x0) {
        operator_delete__(nodes);
      }
      nodes = (node_t *)0x0;
      if (subsectors != (subsector_t *)0x0) {
        operator_delete__(subsectors);
      }
      subsectors = (subsector_t *)0x0;
      if (segs != (seg_t *)0x0) {
        operator_delete__(segs);
      }
      segs = (seg_t *)0x0;
      if (bVar10) {
        segs = (seg_t *)0x0;
        return false;
      }
    }
LAB_003f9a55:
    uVar11 = CheckForMissingSegs();
    if (0 < (int)uVar11) {
      Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n",(ulong)uVar11);
    }
    return uVar11 == 0;
  }
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  nodes = (node_t *)0x0;
LAB_003f9a7f:
  if (subsectors != (subsector_t *)0x0) {
    operator_delete__(subsectors);
  }
  subsectors = (subsector_t *)0x0;
  if (segs != (seg_t *)0x0) {
    operator_delete__(segs);
  }
  segs = (seg_t *)0x0;
  return false;
}

Assistant:

static bool DoLoadGLNodes(FileReader ** lumps)
{
	if (!LoadGLVertexes(lumps[0]))
	{
		return false;
	}
	if (!LoadGLSegs(lumps[1]))
	{
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadGLSubsectors(lumps[2]))
	{
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadNodes(lumps[3]))
	{
		delete [] nodes;
		nodes = NULL;
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}

	// Quick check for the validity of the nodes
	// For invalid nodes there is a high chance that this test will fail

	for (int i = 0; i < numsubsectors; i++)
	{
		seg_t * seg = subsectors[i].firstline;
		if (!seg->sidedef) 
		{
			Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
			delete [] nodes;
			nodes = NULL;
			delete [] subsectors;
			subsectors = NULL;
			delete [] segs;
			segs = NULL;
			return false;
		}
	}

	// check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n", missing);
	}
	return missing == 0;
}